

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_longlink(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  
  wVar1 = read_body_to_string(a,(tar *)&tar->longlink,(archive_string *)h,unconsumed,unconsumed);
  if (wVar1 == L'\0') {
    wVar1 = tar_read_header(a,tar,entry,unconsumed);
    if ((wVar1 == L'\0') || (wVar1 == L'\xffffffec')) {
      archive_entry_copy_link(entry,(tar->longlink).s);
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
header_longlink(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	err = read_body_to_string(a, tar, &(tar->longlink), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);
	/* Set symlink if symlink already set, else hardlink. */
	archive_entry_copy_link(entry, tar->longlink.s);
	return (ARCHIVE_OK);
}